

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3ResetOneSchema(sqlite3 *db,int iDb)

{
  Schema *pSVar1;
  int local_18;
  int i;
  int iDb_local;
  sqlite3 *db_local;
  
  if (-1 < iDb) {
    pSVar1 = db->aDb[iDb].pSchema;
    pSVar1->schemaFlags = pSVar1->schemaFlags | 8;
    pSVar1 = db->aDb[1].pSchema;
    pSVar1->schemaFlags = pSVar1->schemaFlags | 8;
    db->mDbFlags = db->mDbFlags & 0xffffffef;
  }
  if (db->nSchemaLock == 0) {
    for (local_18 = 0; local_18 < db->nDb; local_18 = local_18 + 1) {
      if (((db->aDb[local_18].pSchema)->schemaFlags & 8) == 8) {
        sqlite3SchemaClear(db->aDb[local_18].pSchema);
      }
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ResetOneSchema(sqlite3 *db, int iDb){
  int i;
  assert( iDb<db->nDb );

  if( iDb>=0 ){
    assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
    DbSetProperty(db, iDb, DB_ResetWanted);
    DbSetProperty(db, 1, DB_ResetWanted);
    db->mDbFlags &= ~DBFLAG_SchemaKnownOk;
  }

  if( db->nSchemaLock==0 ){
    for(i=0; i<db->nDb; i++){
      if( DbHasProperty(db, i, DB_ResetWanted) ){
        sqlite3SchemaClear(db->aDb[i].pSchema);
      }
    }
  }
}